

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RangeSelectSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RangeSelectSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,ExpressionSyntax *args_1,Token *args_2,
          ExpressionSyntax *args_3)

{
  Token range;
  RangeSelectSyntax *pRVar1;
  RangeSelectSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  BumpAllocator *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pRVar1 = (RangeSelectSyntax *)allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  range.info = in_RSI;
  range.kind = (short)in_RDX;
  range._2_1_ = (char)((ulong)in_RDX >> 0x10);
  range.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  range.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::RangeSelectSyntax::RangeSelectSyntax
            (in_RCX,(SyntaxKind)((ulong)in_R8 >> 0x20),
             (ExpressionSyntax *)(in_RCX->super_SelectorSyntax).super_SyntaxNode.parent,range,
             *(ExpressionSyntax **)&(in_RCX->super_SelectorSyntax).super_SyntaxNode);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }